

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkPipelineRenderingCreateInfoKHR *create_info,ScratchAllocator *alloc,
          VkGraphicsPipelineLibraryFlagsEXT state_flags)

{
  void *pvVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  VkFormat *pVVar4;
  undefined8 *puVar5;
  void *__dest;
  size_t size;
  
  puVar5 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x28,0x10);
  if (puVar5 != (undefined8 *)0x0) {
    uVar2 = *(undefined8 *)create_info;
    pvVar1 = create_info->pNext;
    uVar3 = *(undefined8 *)&create_info->viewMask;
    pVVar4 = create_info->pColorAttachmentFormats;
    puVar5[4] = *(undefined8 *)&create_info->depthAttachmentFormat;
    puVar5[2] = uVar3;
    puVar5[3] = pVVar4;
    *puVar5 = uVar2;
    puVar5[1] = pvVar1;
  }
  if ((state_flags & 8) == 0) {
    *(undefined8 *)((long)puVar5 + 0x14) = 0;
    *(undefined8 *)((long)puVar5 + 0x1c) = 0;
    *(undefined4 *)((long)puVar5 + 0x24) = 0;
    if ((state_flags & 6) != 0) {
      return puVar5;
    }
    *(undefined4 *)(puVar5 + 2) = 0;
    return puVar5;
  }
  if ((ulong)*(uint *)((long)puVar5 + 0x14) != 0) {
    pvVar1 = (void *)puVar5[3];
    size = (ulong)*(uint *)((long)puVar5 + 0x14) << 2;
    __dest = ScratchAllocator::allocate_raw(alloc,size,0x10);
    if (__dest != (void *)0x0) {
      memmove(__dest,pvVar1,size);
      goto LAB_00128869;
    }
  }
  __dest = (void *)0x0;
LAB_00128869:
  puVar5[3] = __dest;
  return puVar5;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkPipelineRenderingCreateInfoKHR *create_info,
                                             ScratchAllocator &alloc,
                                             VkGraphicsPipelineLibraryFlagsEXT state_flags)
{
	auto *rendering = copy(create_info, 1, alloc);

	bool view_mask_sensitive = (state_flags & (VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_OUTPUT_INTERFACE_BIT_EXT |
	                                           VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_SHADER_BIT_EXT |
	                                           VK_GRAPHICS_PIPELINE_LIBRARY_PRE_RASTERIZATION_SHADERS_BIT_EXT)) != 0;
	bool format_sensitive = (state_flags & VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_OUTPUT_INTERFACE_BIT_EXT) != 0;

	if (format_sensitive)
	{
		rendering->pColorAttachmentFormats =
				copy(rendering->pColorAttachmentFormats, rendering->colorAttachmentCount, alloc);
	}
	else
	{
		rendering->colorAttachmentCount = 0;
		rendering->pColorAttachmentFormats = nullptr;
		rendering->depthAttachmentFormat = VK_FORMAT_UNDEFINED;
		rendering->stencilAttachmentFormat = VK_FORMAT_UNDEFINED;
		if (!view_mask_sensitive)
			rendering->viewMask = 0;
	}

	return rendering;
}